

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

fourcc_t NodeEnumClassFilterRated
                   (anynode *AnyContext,array *ListId,fourcc_t ClassId,nodeenumclassfilterrated Func
                   ,void *Param)

{
  nodeclass **ppnVar1;
  short sVar2;
  long lVar3;
  nodeclass *pnVar4;
  int iVar5;
  nodeclass *pnVar6;
  bool_t bVar7;
  char *pcVar8;
  long *plVar9;
  ulong uVar10;
  nodeclassrated Item;
  fourcc_t local_64;
  int local_5c;
  array local_58;
  long local_40;
  int local_38;
  
  if (AnyContext == (anynode *)0x0) {
    __assert_fail("AnyContext != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x678,
                  "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                 );
  }
  lVar3 = **(long **)((long)AnyContext + 8);
  local_58._Begin = (char *)0x0;
  local_58._Used = 0;
  local_64 = 0;
  if (7 < *(ulong *)(lVar3 + 0x78)) {
    plVar9 = *(long **)(lVar3 + 0x70);
    local_5c = 0;
    sVar2 = 0;
    local_64 = 0;
    do {
      pnVar4 = (nodeclass *)*plVar9;
      if ((-1 < pnVar4->State) &&
         (pnVar6 = pnVar4, pnVar4 != (nodeclass *)0x0 && (pnVar4->Flags & 8) == 0)) {
        do {
          if (*(fourcc_t *)&pnVar6[1].Meta == ClassId) {
            if (Func == (nodeenumclassfilterrated)0x0) {
              iVar5 = 1;
            }
            else {
              iVar5 = (*Func)(Param,pnVar4);
            }
            if (0 < iVar5) {
              if (ListId == (array *)0x0) {
                if ((local_5c < iVar5) ||
                   ((local_5c == iVar5 && (sVar2 < *(short *)(*plVar9 + 0x3e))))) {
                  local_64 = *(fourcc_t *)(*plVar9 + 0x50);
                  sVar2 = *(short *)(*plVar9 + 0x3e);
                  local_5c = iVar5;
                }
              }
              else {
                local_40 = *plVar9;
                local_38 = iVar5;
                ArrayAppend(&local_58,&local_40,0x10,0x40);
              }
            }
            break;
          }
          ppnVar1 = &pnVar6->ParentClass;
          pnVar6 = *ppnVar1;
        } while (*ppnVar1 != (nodeclass *)0x0);
      }
      plVar9 = plVar9 + 1;
    } while (plVar9 != (long *)((*(ulong *)(lVar3 + 0x78) & 0xfffffffffffffff8) +
                               *(long *)(lVar3 + 0x70)));
  }
  if (ListId != (array *)0x0) {
    uVar10 = local_58._Used >> 4;
    ArraySortEx(&local_58,uVar10,0x10,CmpRatedClassPri,(void *)0x0,0);
    ListId->_Begin = (char *)0x0;
    ListId->_Used = 0;
    bVar7 = ArrayAppend(ListId,(void *)0x0,uVar10 << 2,0x40);
    if ((bVar7 != 0) && (0xf < local_58._Used)) {
      pcVar8 = ListId->_Begin;
      uVar10 = 0;
      do {
        *(undefined4 *)pcVar8 = *(undefined4 *)(*(long *)(local_58._Begin + uVar10) + 0x50);
        pcVar8 = pcVar8 + 4;
        uVar10 = uVar10 + 0x10;
      } while ((local_58._Used & 0xfffffffffffffff0) != uVar10);
    }
    ArrayClear(&local_58);
  }
  return local_64;
}

Assistant:

fourcc_t NodeEnumClassFilterRated(anynode* AnyContext, array* ListId, fourcc_t ClassId, nodeenumclassfilterrated Func, void* Param)
{
    nodecontext* p;
    const nodeclass* v;
    const nodeclass **i;
    array List;

    fourcc_t BestId = 0;
    int BestPri = 0;
    int BestRate = 0;

    assert(AnyContext != NULL);
    p = Node_Context(AnyContext);

    ArrayInit(&List);

    for (i=ARRAYBEGIN(p->NodeClass,const nodeclass*);i!=ARRAYEND(p->NodeClass,const nodeclass*);++i)
    {
        if ((*i)->State>=CLASS_REGISTERED && !((*i)->Flags & CFLAG_ABSTRACT)) // skip abstract
        {
            for (v=*i;v;v=v->ParentClass)
                if (NodeClass_ClassId(v) == ClassId)
                {
                    int Rating = Func ? Func(Param,*i):1;
                    if (Rating > 0)
                    {
                        if (!ListId)
                        {
                            if (BestRate < Rating || (BestRate == Rating && BestPri < (*i)->Priority))
                            {
                                BestId = NodeClass_ClassId(*i);
                                BestPri = (*i)->Priority;
                                BestRate = Rating;
                            }
                        }
                        else
                        {
                            nodeclassrated Item;
                            Item.Class = *i;
                            Item.Rating = Rating;
                            ArrayAppend(&List,&Item,sizeof(Item),64);
                        }
                    }
                    break;
                }
        }
    }

    if (ListId)
    {
        fourcc_t* a;
        nodeclassrated* b;
        size_t Count = ARRAYCOUNT(List,nodeclassrated);
        ArraySort(&List,nodeclassrated,CmpRatedClassPri, NULL, 0);

        ArrayInit(ListId);
        if (ArrayAppend(ListId,NULL,Count*sizeof(fourcc_t),64))
        {
            for (a=ARRAYBEGIN(*ListId,fourcc_t),b=ARRAYBEGIN(List,nodeclassrated);b!=ARRAYEND(List,nodeclassrated);++b,++a)
                *a = NodeClass_ClassId(b->Class);
        }
        ArrayClear(&List);
    }

    return BestId;
}